

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_CEBody.cpp
# Opt level: O2

bool __thiscall test_CEBody::test_Name(test_CEBody *this)

{
  undefined1 uVar1;
  string new_name;
  CEBody test_body;
  allocator local_cd;
  undefined4 local_cc;
  string local_c8;
  string local_a8;
  undefined4 local_88 [8];
  CEBody local_68;
  
  CEBody::Name_abi_cxx11_((string *)&local_68,&this->base_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a8,"Crab",(allocator *)&local_cc);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c8,"test_Name",&local_cd);
  local_88[0] = 0x6c;
  (**(code **)(*(long *)this + 0x70))(this,&local_68,&local_a8,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_cd);
  std::__cxx11::string::~string((string *)&local_a8);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_cc);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a8,"",(allocator *)&local_c8);
  CEBody::CEBody(&local_68,&this->base_,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a8,"NotCrab",(allocator *)&local_c8);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_c8);
  CEBody::SetName(&local_68,&local_a8);
  CEBody::Name_abi_cxx11_(&local_c8,&local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_88,"test_Name",&local_cd);
  local_cc = 0x72;
  (**(code **)(*(long *)this + 0x70))(this,&local_c8,&local_a8,local_88);
  std::__cxx11::string::~string((string *)local_88);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_cd);
  std::__cxx11::string::~string((string *)&local_c8);
  uVar1 = (**(code **)(*(long *)this + 0x18))(this);
  std::__cxx11::string::~string((string *)&local_a8);
  CEBody::~CEBody(&local_68);
  return (bool)uVar1;
}

Assistant:

bool test_CEBody::test_Name(void)
{
    // Check that we can get the name
    test_string(base_.Name(), "Crab", __func__, __LINE__);

    // Check that we can set the name
    CEBody test_body(base_);
    std::string new_name = "NotCrab";
    test_body.SetName(new_name);
    test_string(test_body.Name(), new_name, __func__, __LINE__);

    return pass();
}